

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmain.cpp
# Opt level: O0

int vm_run_image(vm_run_image_params *params)

{
  int iVar1;
  CVmFile *pCVar2;
  undefined8 *puVar3;
  long *plVar4;
  FILE *__stream;
  CVmHostIfc *hostifc;
  undefined8 *in_RDI;
  char *pcVar5;
  char errbuf [512];
  CVmException *exc;
  char *ifid;
  osfildef *exe_fp;
  err_frame_t err_cur__;
  vm_init_options opts;
  vm_globals *vmg__;
  int retval;
  unsigned_long image_file_base;
  CVmImageFile *imagefp;
  CVmImageLoader *loader;
  CVmFile *fp;
  char *in_stack_00000c30;
  char *in_stack_00000c70;
  size_t in_stack_00000c78;
  char *in_stack_00000c80;
  long in_stack_00001c78;
  char *in_stack_00001c80;
  CVmImageFile *in_stack_00001c88;
  CVmImageLoader *in_stack_00001c90;
  vm_init_options *in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc40;
  os_filetype_t in_stack_fffffffffffffc44;
  char *in_stack_fffffffffffffc48;
  TadsNetConfig *in_stack_fffffffffffffc50;
  char *in_stack_fffffffffffffc58;
  TadsNetConfig *pTVar6;
  CVmTimeZoneCache *in_stack_fffffffffffffc60;
  char *in_stack_fffffffffffffc68;
  CVmImageLoader *pCVar7;
  TadsNetConfig *in_stack_fffffffffffffc70;
  CVmException *pCVar8;
  CVmMainClientIfc *clientifc;
  CVmImageLoader *in_stack_fffffffffffffc80;
  undefined1 local_368 [152];
  CVmImageLoader *in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd9c;
  size_t in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffda8;
  CVmException *in_stack_fffffffffffffdb0;
  uint in_stack_fffffffffffffde4;
  char *in_stack_fffffffffffffe08;
  CVmRuntimeSymbols *in_stack_fffffffffffffe10;
  CVmRuntimeSymbols *in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe24;
  char **in_stack_fffffffffffffe28;
  CVmImageLoader *in_stack_fffffffffffffe30;
  uint local_148 [2];
  CVmMainClientIfc *local_140;
  CVmException *local_138;
  __jmp_buf_tag _Stack_130;
  vm_init_options local_68;
  int local_2c;
  long local_28;
  CVmHostIfc *local_20;
  CVmImageLoader *local_18;
  CVmFile *local_10;
  undefined8 *local_8;
  
  local_10 = (CVmFile *)0x0;
  local_18 = (CVmImageLoader *)0x0;
  local_20 = (CVmHostIfc *)0x0;
  local_28 = 0;
  local_8 = in_RDI;
  os_get_abs_filename(in_stack_00000c80,in_stack_00000c78,in_stack_00000c70);
  local_2c = 0;
  pCVar2 = (CVmFile *)operator_new(0x10);
  CVmFile::CVmFile(pCVar2);
  local_10 = pCVar2;
  vm_init_options::vm_init_options
            (&local_68,(CVmHostIfc *)local_8[1],(CVmMainClientIfc *)*local_8,(char *)local_8[0xb],
             (char *)local_8[0xc]);
  vm_initialize((vm_globals **)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                in_stack_fffffffffffffc38);
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  local_140 = (CVmMainClientIfc *)*puVar3;
  plVar4 = (long *)_ZTW11G_err_frame();
  *plVar4 = (long)local_148;
  local_148[0] = _setjmp(&_Stack_130);
  if (local_148[0] == 0) {
    if (local_8[0xe] != 0) {
      (**(code **)(*(long *)local_8[1] + 0x48))((long *)local_8[1],local_8[0xe]);
    }
    if (local_8[0xf] != 0) {
      G_file_path_X = path_param_to_abs(in_stack_00000c30);
    }
    if (local_8[0x10] == 0) {
      G_sandbox_path_X = file_param_to_abs_path(in_stack_00000c30);
    }
    else {
      G_sandbox_path_X = path_param_to_abs(in_stack_00000c30);
    }
    G_net_config_X = (TadsNetConfig *)local_8[0x11];
    if (local_8[0x12] != 0) {
      CVmTimeZoneCache::set_local_zone(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
    }
    pcVar5 = (char *)0x0;
    if (*(int *)(local_8 + 10) != 0) {
      pcVar5 = "T3 VM 3.1.3 - Copyright 1999, 2012 Michael J. Roberts";
    }
    in_stack_fffffffffffffc40 = *(undefined4 *)(local_8 + 9);
    (**(code **)(*(long *)*local_8 + 0x28))
              ((long *)*local_8,0,local_8[5],*(undefined4 *)(local_8 + 6),local_8[7],local_8[8]);
    if (*(int *)((long)local_8 + 0x4c) == 0) {
      CVmFile::open_read((CVmFile *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                         in_stack_fffffffffffffc44);
    }
    else {
      __stream = (FILE *)os_exeseek(G_os_gamename,"TGAM");
      if (__stream == (FILE *)0x0) {
        err_throw(0);
      }
      local_28 = ftell(__stream);
      CVmFile::set_file(local_10,(osfildef *)__stream,local_28);
    }
    hostifc = (CVmHostIfc *)operator_new(0x20);
    CVmImageFileExt::CVmImageFileExt
              ((CVmImageFileExt *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
               (CVmFile *)pcVar5);
    local_20 = hostifc;
    in_stack_fffffffffffffc80 = (CVmImageLoader *)operator_new(0x98);
    CVmImageLoader::CVmImageLoader
              (in_stack_00001c90,in_stack_00001c88,in_stack_00001c80,in_stack_00001c78);
    local_18 = in_stack_fffffffffffffc80;
    CVmImageLoader::load(in_stack_fffffffffffffd30);
    (**(code **)(*(long *)*local_8 + 0x38))((long *)*local_8,0);
    if (*(int *)((long)local_8 + 0x54) != 0) {
      CVmBifTADS::randomize(in_stack_fffffffffffffde4);
    }
    if ((local_8[0x11] != 0) && (pcVar5 = vm_get_ifid(hostifc), pcVar5 != (char *)0x0)) {
      TadsNetConfig::set(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68,
                         (char *)in_stack_fffffffffffffc60);
      free(pcVar5);
    }
    CVmImageLoader::run(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                        in_stack_fffffffffffffe24,in_stack_fffffffffffffe18,
                        in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    (**(code **)(*(long *)*local_8 + 0x40))((long *)*local_8,0);
  }
  pCVar8 = local_138;
  if (local_148[0] == 1) {
    local_148[0] = 2;
    iVar1 = CVmException::get_error_code(local_138);
    if (iVar1 != 0x95a) {
      (**(code **)(*(long *)*local_8 + 0x48))((long *)*local_8,0);
      local_2c = CVmException::get_error_code(pCVar8);
      CVmRun::get_exc_message
                (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                 in_stack_fffffffffffffd9c);
      (**(code **)(*(long *)*local_8 + 0x50))((long *)*local_8,0,pCVar8,local_368,0);
    }
  }
  clientifc = local_140;
  puVar3 = (undefined8 *)_ZTW11G_err_frame();
  *puVar3 = clientifc;
  if ((local_148[0] & 0x4001) != 0) {
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(uint *)*puVar3 & 2) != 0) {
      plVar4 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar4 + 0x10));
    }
    pCVar8 = local_138;
    plVar4 = (long *)_ZTW11G_err_frame();
    *(CVmException **)(*plVar4 + 0x10) = pCVar8;
    err_rethrow();
  }
  if ((local_148[0] & 2) != 0) {
    free(local_138);
  }
  lib_free_str((char *)0x248aa4);
  lib_free_str((char *)0x248ab3);
  if (local_18 != (CVmImageLoader *)0x0) {
    CVmImageLoader::unload((CVmImageLoader *)0x248ace);
  }
  if ((local_18 != (CVmImageLoader *)0x0) && (local_18 != (CVmImageLoader *)0x0)) {
    pCVar7 = local_18;
    CVmImageLoader::~CVmImageLoader(in_stack_fffffffffffffc80);
    operator_delete(pCVar7,0x98);
  }
  if ((local_20 != (CVmHostIfc *)0x0) && (local_20 != (CVmHostIfc *)0x0)) {
    (*local_20->_vptr_CVmHostIfc[1])();
  }
  (**(code **)(*(long *)*local_8 + 0x30))((long *)*local_8,0);
  if ((G_net_config_X != (TadsNetConfig *)0x0) && (G_net_config_X != (TadsNetConfig *)0x0)) {
    pTVar6 = G_net_config_X;
    TadsNetConfig::~TadsNetConfig(in_stack_fffffffffffffc50);
    operator_delete(pTVar6,0x10);
  }
  vm_terminate((vm_globals *)in_stack_fffffffffffffc80,clientifc);
  if ((local_10 != (CVmFile *)0x0) && (local_10 != (CVmFile *)0x0)) {
    pCVar2 = local_10;
    CVmFile::~CVmFile((CVmFile *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40));
    operator_delete(pCVar2,0x10);
  }
  return local_2c;
}

Assistant:

int vm_run_image(const vm_run_image_params *params)
{
    CVmFile *fp = 0;
    CVmImageLoader *volatile loader = 0;
    CVmImageFile *volatile imagefp = 0;
    unsigned long image_file_base = 0;
    int retval;
    vm_globals *vmg__;

    /* 
     *   get the full absolute path for the image file, to ensure that future
     *   references are independent of working directory changes 
     */
    os_get_abs_filename(G_os_gamename, sizeof(G_os_gamename),
                        params->image_file_name);

    /* presume we will return success */
    retval = 0;

    /* make sure the local time zone settings are initialized */
    os_tzset();

    /* create the file object */
    fp = new CVmFile();

    /* initialize the VM */
    vm_init_options opts(params->hostifc, params->clientifc,
                         params->charset, params->log_charset);
    vm_initialize(&vmg__, &opts);

    /* catch any errors that occur during loading and running */
    err_try
    {
        /* if we have a resource root path, tell the host interface */
        if (params->res_dir != 0)
            params->hostifc->set_res_dir(params->res_dir);
        
        /* 
         *   Save the default working directory for file operations, if
         *   specified.  If it's not specified, use the image file directory
         *   as the default. 
         */
        if (params->file_dir != 0)
            G_file_path = path_param_to_abs(params->file_dir);
        
        /* set the sandbox directory (for file safety restrictions) */
        if (params->sandbox_dir != 0)
            G_sandbox_path = path_param_to_abs(params->sandbox_dir);
        else
            G_sandbox_path = file_param_to_abs_path(params->image_file_name);
        
        /* set the networking configuration in the globals */
        G_net_config = params->netconfig;

        /* set the local time zone, if specified */
        if (params->timezone)
            G_tzcache->set_local_zone(params->timezone);
        
        /* tell the client system to initialize */
        params->clientifc->client_init(
            VMGLOB_ADDR,
            params->script_file, params->script_quiet,
            params->log_file, params->cmd_log_file,
            params->show_banner ? T3VM_BANNER_STRING : 0,
            params->more_mode);
        
        /* open the byte-code file */
        if (params->load_from_exe)
        {
            /* find the image within the executable */
            osfildef *exe_fp = os_exeseek(G_os_gamename, "TGAM");
            if (exe_fp == 0)
                err_throw(VMERR_NO_IMAGE_IN_EXE);

            /* 
             *   set up to read from the executable at the location of the
             *   embedded image file that we just found 
             */
            image_file_base = osfpos(exe_fp);
            fp->set_file(exe_fp, image_file_base);
        }
        else
        {
            /* reading from a normal file - open the file */
            fp->open_read(G_os_gamename, OSFTT3IMG);
        }

        /* create the loader */
        imagefp = new CVmImageFileExt(fp);
        loader = new CVmImageLoader(imagefp, G_os_gamename, image_file_base);

        /* load the image */
        loader->load(vmg0_);

        /* let the client prepare for execution */
        params->clientifc->pre_exec(VMGLOB_ADDR);

        /* if desired, seed the random number generator */
        if (params->seed_rand)
            CVmBifTADS::randomize(vmg_ 0);

#ifdef TADSNET
        /* 
         *   if we have a network configuration, get the game's IFID - this
         *   is needed to identify the game to the storage server 
         */
        if (params->netconfig != 0)
        {
            char *ifid = vm_get_ifid(params->hostifc);
            if (ifid != 0)
            {
                params->netconfig->set("ifid", ifid);
                t3free(ifid);
            }
        }
#endif /* TADSNET */

        /* run the program from the main entrypoint */
        loader->run(vmg_ params->prog_argv, params->prog_argc,
                    0, 0, params->saved_state);

        /* tell the client we're done with execution */
        params->clientifc->post_exec(VMGLOB_ADDR);
    }